

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<slang::ast::DriverVisitor,_true,_true,_false,_false>::
visit<slang::ast::ImplicitEventControl>
          (ASTVisitor<slang::ast::DriverVisitor,_true,_true,_false,_false> *this,
          ImplicitEventControl *t)

{
  bool bVar1;
  TimingControl *in_RSI;
  ASTVisitor<slang::ast::DriverVisitor,_true,_true,_false,_false> *in_RDI;
  
  bVar1 = TimingControl::bad(in_RSI);
  if (!bVar1) {
    visitDefault<slang::ast::ImplicitEventControl>(in_RDI,(ImplicitEventControl *)in_RSI);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }